

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

VIface * __thiscall viface::VIface::getName_abi_cxx11_(VIface *this)

{
  unique_ptr<viface::VIfaceImpl,_std::default_delete<viface::VIfaceImpl>_> *in_RSI;
  VIface *this_local;
  
  std::unique_ptr<viface::VIfaceImpl,_std::default_delete<viface::VIfaceImpl>_>::operator->(in_RSI);
  VIfaceImpl::getName_abi_cxx11_((VIfaceImpl *)this);
  return this;
}

Assistant:

string VIface::getName() const {
    return this->pimpl->getName();
}